

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCopiesAndBlittingTests.cpp
# Opt level: O3

void vkt::api::anon_unknown_0::addBlittingImageAllFormatsColorSrcFormatDstFormatTests
               (TestCaseGroup *group,BlitColorTestParams *testParams)

{
  pointer pCVar1;
  long *plVar2;
  undefined8 *puVar3;
  BlittingTestCase *pBVar4;
  pointer pCVar5;
  long lVar6;
  undefined8 in_RCX;
  ulong *puVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  undefined *puVar9;
  VkImageLayout extraout_EDX;
  VkImageLayout extraout_EDX_00;
  VkImageLayout layout;
  undefined8 in_RDX;
  undefined8 *extraout_RDX;
  undefined8 *puVar10;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  ulong uVar11;
  char *pcVar12;
  pointer pcVar13;
  undefined8 uVar14;
  string *psVar15;
  size_t sVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string description;
  string testName;
  undefined1 local_1b0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  undefined1 local_180 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  long *local_150;
  long local_148;
  long local_140;
  undefined8 uStack_138;
  uint local_130;
  uint local_12c;
  TestNode *local_128;
  TestContext *local_120;
  string local_118;
  string local_f8;
  Data local_d8;
  VkDeviceSize VStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  pointer local_a8;
  long local_a0;
  long local_98;
  anon_union_4_2_42ec4cd4_for_TestParams_4 local_90;
  Data local_88;
  VkDeviceSize VStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  pointer local_58;
  long local_50;
  long local_48;
  anon_union_4_2_42ec4cd4_for_TestParams_4 local_40;
  
  local_120 = (group->super_TestNode).m_testCtx;
  puVar9 = (undefined *)CONCAT71((int7)((ulong)in_RCX >> 8),1);
  lVar6 = 0;
  local_128 = &group->super_TestNode;
  do {
    local_130 = (uint)puVar9;
    (testParams->params).src.image.operationLayout = (&DAT_00ad7f80)[lVar6];
    puVar9 = &DAT_00ad7f01;
    lVar6 = 0;
    do {
      psVar15 = (string *)(local_180 + 0x10);
      local_12c = (uint)puVar9;
      (testParams->params).dst.image.operationLayout = (&DAT_00ad7f88)[lVar6];
      (testParams->params).field_3.filter = VK_FILTER_NEAREST;
      api::(anonymous_namespace)::getImageLayoutCaseName_abi_cxx11_
                ((string *)local_1b0,
                 (_anonymous_namespace_ *)(ulong)(testParams->params).src.image.operationLayout,
                 (VkImageLayout)in_RDX);
      plVar2 = (long *)std::__cxx11::string::append((char *)local_1b0);
      local_190._M_allocated_capacity = (size_type)local_180;
      puVar7 = (ulong *)(plVar2 + 2);
      if ((ulong *)*plVar2 == puVar7) {
        local_180._0_8_ = *puVar7;
        local_180._8_8_ = plVar2[3];
      }
      else {
        local_180._0_8_ = *puVar7;
        local_190._M_allocated_capacity = (size_type)(ulong *)*plVar2;
      }
      local_190._8_8_ = plVar2[1];
      *plVar2 = (long)puVar7;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      api::(anonymous_namespace)::getImageLayoutCaseName_abi_cxx11_
                (psVar15,(_anonymous_namespace_ *)
                         (ulong)(testParams->params).dst.image.operationLayout,
                 (VkImageLayout)local_190._8_8_);
      pcVar13 = (pointer)0xf;
      if ((undefined1 *)local_190._M_allocated_capacity != local_180) {
        pcVar13 = (pointer)local_180._0_8_;
      }
      if (pcVar13 < (pointer)(local_180._24_8_ + local_190._8_8_)) {
        uVar14 = (pointer)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._16_8_ != &local_160) {
          uVar14 = local_160._M_allocated_capacity;
        }
        if ((ulong)uVar14 < (pointer)(local_180._24_8_ + local_190._8_8_)) goto LAB_00475cf2;
        puVar3 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)psVar15,0,(char *)0x0,local_190._M_allocated_capacity);
      }
      else {
LAB_00475cf2:
        puVar3 = (undefined8 *)
                 std::__cxx11::string::_M_append(local_190._M_local_buf,local_180._16_8_);
      }
      local_150 = &local_140;
      plVar2 = puVar3 + 2;
      if ((long *)*puVar3 == plVar2) {
        local_140 = *plVar2;
        uStack_138 = puVar3[3];
      }
      else {
        local_140 = *plVar2;
        local_150 = (long *)*puVar3;
      }
      puVar10 = puVar3 + 1;
      local_148 = puVar3[1];
      *puVar3 = plVar2;
      *puVar10 = 0;
      *(undefined1 *)plVar2 = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._16_8_ != &local_160) {
        operator_delete((void *)local_180._16_8_,local_160._M_allocated_capacity + 1);
        puVar10 = extraout_RDX;
      }
      layout = (VkImageLayout)puVar10;
      if ((undefined1 *)local_190._M_allocated_capacity != local_180) {
        operator_delete((void *)local_190._M_allocated_capacity,(ulong)(local_180._0_8_ + 1));
        layout = extraout_EDX;
      }
      if ((string *)local_1b0._0_8_ != (string *)(local_1b0 + 0x10)) {
        operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
        layout = extraout_EDX_00;
      }
      api::(anonymous_namespace)::getImageLayoutCaseName_abi_cxx11_
                (&local_f8,
                 (_anonymous_namespace_ *)(ulong)(testParams->params).src.image.operationLayout,
                 layout);
      plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,0xad8cbe);
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 == paVar8) {
        local_160._M_allocated_capacity = paVar8->_M_allocated_capacity;
        local_160._8_8_ = plVar2[3];
        local_180._16_8_ = &local_160;
      }
      else {
        local_160._M_allocated_capacity = paVar8->_M_allocated_capacity;
        local_180._16_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar2;
      }
      local_180._24_8_ = plVar2[1];
      *plVar2 = (long)paVar8;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)psVar15);
      local_1b0._0_8_ = local_1b0 + 0x10;
      puVar7 = (ulong *)(plVar2 + 2);
      if ((ulong *)*plVar2 == puVar7) {
        local_1b0._16_8_ = *puVar7;
        local_1b0._24_8_ = plVar2[3];
      }
      else {
        local_1b0._16_8_ = *puVar7;
        local_1b0._0_8_ = (ulong *)*plVar2;
      }
      local_1b0._8_8_ = plVar2[1];
      *plVar2 = (long)puVar7;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      api::(anonymous_namespace)::getImageLayoutCaseName_abi_cxx11_
                (&local_118,
                 (_anonymous_namespace_ *)(ulong)(testParams->params).dst.image.operationLayout,
                 (VkImageLayout)local_1b0._8_8_);
      uVar11 = 0xf;
      if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
        uVar11 = local_1b0._16_8_;
      }
      if (uVar11 < local_118._M_string_length + local_1b0._8_8_) {
        uVar14 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          uVar14 = local_118.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar14 < local_118._M_string_length + local_1b0._8_8_) goto LAB_00475ec2;
        plVar2 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_118,0,(char *)0x0,local_1b0._0_8_);
      }
      else {
LAB_00475ec2:
        plVar2 = (long *)std::__cxx11::string::_M_append
                                   ((char *)local_1b0,(ulong)local_118._M_dataplus._M_p);
      }
      local_190._M_allocated_capacity = (size_type)local_180;
      psVar15 = (string *)(plVar2 + 2);
      if ((string *)*plVar2 == psVar15) {
        local_180._0_8_ = (psVar15->_M_dataplus)._M_p;
        local_180._8_8_ = plVar2[3];
      }
      else {
        local_180._0_8_ = (psVar15->_M_dataplus)._M_p;
        local_190._M_allocated_capacity = (size_type)(string *)*plVar2;
      }
      local_190._8_8_ = plVar2[1];
      *plVar2 = (long)psVar15;
      plVar2[1] = 0;
      *(undefined1 *)&(psVar15->_M_dataplus)._M_p = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
        operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._16_8_ != &local_160) {
        operator_delete((void *)local_180._16_8_,local_160._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      pBVar4 = (BlittingTestCase *)operator_new(0xc0);
      local_1b0._0_8_ = local_1b0 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1b0,local_150,(undefined1 *)(local_148 + (long)local_150));
      pcVar12 = "_nearest";
      std::__cxx11::string::append((char *)local_1b0);
      local_88.buffer.size = (Buffer)(testParams->params).src.buffer.size;
      local_88._8_8_ = *(undefined8 *)((long)&(testParams->params).src + 8);
      local_88._16_8_ = *(undefined8 *)((long)&(testParams->params).src + 0x10);
      VStack_70 = (testParams->params).dst.buffer.size;
      local_68 = *(undefined8 *)((long)&(testParams->params).dst + 8);
      uStack_60 = *(undefined8 *)((long)&(testParams->params).dst + 0x10);
      uVar11 = (long)(testParams->params).regions.
                     super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(testParams->params).regions.
                     super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      pCVar5 = std::
               _Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
               ::_M_allocate((_Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
                              *)(((long)uVar11 >> 4) * -0x3333333333333333),(size_t)pcVar12);
      local_48 = (long)pCVar5 + uVar11;
      pCVar1 = (testParams->params).regions.
               super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
               ._M_impl.super__Vector_impl_data._M_start;
      sVar16 = (long)(testParams->params).regions.
                     super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1;
      local_58 = pCVar5;
      if (sVar16 != 0) {
        memmove(pCVar5,pCVar1,sVar16);
      }
      local_50 = sVar16 + (long)pCVar5;
      local_40 = (testParams->params).field_3;
      BlittingTestCase::BlittingTestCase
                (pBVar4,local_120,(string *)local_1b0._0_8_,
                 (string *)local_190._M_allocated_capacity,(TestParams *)&local_88.buffer);
      tcu::TestNode::addChild(local_128,(TestNode *)pBVar4);
      in_RDX = extraout_RDX_00;
      if (pCVar5 != (pointer)0x0) {
        operator_delete(pCVar5,uVar11);
        in_RDX = extraout_RDX_01;
      }
      if ((string *)local_1b0._0_8_ != (string *)(local_1b0 + 0x10)) {
        operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
        in_RDX = extraout_RDX_02;
      }
      if (testParams->onlyNearest == false) {
        (testParams->params).field_3.filter = VK_FILTER_LINEAR;
        pBVar4 = (BlittingTestCase *)operator_new(0xc0);
        local_1b0._0_8_ = local_1b0 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1b0,local_150,(undefined1 *)(local_148 + (long)local_150));
        pcVar12 = "_linear";
        std::__cxx11::string::append((char *)local_1b0);
        local_d8.buffer.size = (Buffer)(testParams->params).src.buffer.size;
        local_d8._8_8_ = *(undefined8 *)((long)&(testParams->params).src + 8);
        local_d8._16_8_ = *(undefined8 *)((long)&(testParams->params).src + 0x10);
        VStack_c0 = (testParams->params).dst.buffer.size;
        local_b8 = *(undefined8 *)((long)&(testParams->params).dst + 8);
        uStack_b0 = *(undefined8 *)((long)&(testParams->params).dst + 0x10);
        uVar11 = (long)(testParams->params).regions.
                       super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(testParams->params).regions.
                       super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        pCVar5 = std::
                 _Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
                 ::_M_allocate((_Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
                                *)(((long)uVar11 >> 4) * -0x3333333333333333),(size_t)pcVar12);
        local_98 = (long)pCVar5 + uVar11;
        pCVar1 = (testParams->params).regions.
                 super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        sVar16 = (long)(testParams->params).regions.
                       super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1;
        local_a8 = pCVar5;
        if (sVar16 != 0) {
          memmove(pCVar5,pCVar1,sVar16);
        }
        local_a0 = sVar16 + (long)pCVar5;
        local_90 = (testParams->params).field_3;
        BlittingTestCase::BlittingTestCase
                  (pBVar4,local_120,(string *)local_1b0._0_8_,
                   (string *)local_190._M_allocated_capacity,(TestParams *)&local_d8.buffer);
        tcu::TestNode::addChild(local_128,(TestNode *)pBVar4);
        in_RDX = extraout_RDX_03;
        if (pCVar5 != (pointer)0x0) {
          operator_delete(pCVar5,uVar11);
          in_RDX = extraout_RDX_04;
        }
        if ((string *)local_1b0._0_8_ != (string *)(local_1b0 + 0x10)) {
          operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
          in_RDX = extraout_RDX_05;
        }
      }
      if ((string *)local_190._M_allocated_capacity != (string *)local_180) {
        operator_delete((void *)local_190._M_allocated_capacity,(ulong)(local_180._0_8_ + 1));
        in_RDX = extraout_RDX_06;
      }
      if (local_150 != &local_140) {
        operator_delete(local_150,local_140 + 1);
        in_RDX = extraout_RDX_07;
      }
      lVar6 = 1;
      puVar9 = (undefined *)0x0;
    } while ((local_12c & 1) != 0);
    if ((local_130 & 1) == 0) {
      return;
    }
  } while( true );
}

Assistant:

void addBlittingImageAllFormatsColorSrcFormatDstFormatTests (tcu::TestCaseGroup* group, BlitColorTestParams testParams)
{
	tcu::TestContext& testCtx				= group->getTestContext();

	const VkImageLayout blitSrcLayouts[]	=
	{
		VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
		VK_IMAGE_LAYOUT_GENERAL
	};
	const VkImageLayout blitDstLayouts[]	=
	{
		VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
		VK_IMAGE_LAYOUT_GENERAL
	};

	for (int srcLayoutNdx = 0u; srcLayoutNdx < DE_LENGTH_OF_ARRAY(blitSrcLayouts); ++srcLayoutNdx)
	{
		testParams.params.src.image.operationLayout = blitSrcLayouts[srcLayoutNdx];
		for (int dstLayoutNdx = 0u; dstLayoutNdx < DE_LENGTH_OF_ARRAY(blitDstLayouts); ++dstLayoutNdx)
		{
			testParams.params.dst.image.operationLayout = blitDstLayouts[dstLayoutNdx];

			testParams.params.filter			= VK_FILTER_NEAREST;
			const std::string testName			= getImageLayoutCaseName(testParams.params.src.image.operationLayout) + "_" +
												  getImageLayoutCaseName(testParams.params.dst.image.operationLayout);
			const std::string description		= "Blit from layout " + getImageLayoutCaseName(testParams.params.src.image.operationLayout) +
												  " to " + getImageLayoutCaseName(testParams.params.dst.image.operationLayout);
			group->addChild(new BlittingTestCase(testCtx, testName + "_nearest", description, testParams.params));

			if (!testParams.onlyNearest)
			{
				testParams.params.filter		= VK_FILTER_LINEAR;
				group->addChild(new BlittingTestCase(testCtx, testName + "_linear", description, testParams.params));
			}
		}
	}
}